

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

size_t sx_os_maxstacksz(void)

{
  undefined1 local_18 [8];
  rlimit limit;
  
  getrlimit(RLIMIT_STACK,(rlimit *)local_18);
  return limit.rlim_cur;
}

Assistant:

size_t sx_os_maxstacksz(void)
{
#if SX_PLATFORM_WINDOWS
    return 1073741824;    // 1gb
#elif SX_PLATFORM_POSIX
    struct rlimit limit;
    getrlimit(RLIMIT_STACK, &limit);
    return limit.rlim_max;
#endif
}